

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testJacobiEigenSolver<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint i;
  long lVar8;
  float *pfVar9;
  uint i_1;
  float (*pafVar10) [3];
  uint j;
  long lVar11;
  uint j_1;
  float fVar12;
  float fVar13;
  float threshold;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  TV S;
  Matrix33<float> tmp;
  float local_188 [12];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Vec3 local_f4 [12];
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float local_68 [12];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  fVar12 = 0.0;
  lVar8 = 0;
  pafVar10 = (float (*) [3])A;
  do {
    lVar11 = 0;
    fVar13 = fVar12;
    do {
      fVar12 = ABS((*(float (*) [3])*pafVar10)[lVar11]);
      if (fVar12 <= fVar13) {
        fVar12 = fVar13;
      }
      lVar11 = lVar11 + 1;
      fVar13 = fVar12;
    } while (lVar11 != 3);
    lVar8 = lVar8 + 1;
    pafVar10 = pafVar10 + 1;
  } while (lVar8 != 3);
  fVar13 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar12) {
    fVar13 = fVar12;
  }
  threshold = fVar13 * 100.0 * 1.1920929e-07;
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  local_18 = A->x[2][2];
  local_68[0] = 1.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 1.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[8] = 1.0;
  Imath_3_2::jacobiEigenSolver<float>
            ((Matrix33 *)&local_38,local_f4,(Matrix33 *)local_68,1.1920929e-07);
  verifyOrthonormal<Imath_3_2::Matrix33<float>>((Matrix33<float> *)local_68,threshold);
  fVar7 = local_68[8];
  fVar12 = local_68[0];
  fVar13 = local_68[1];
  fVar3 = local_68[4];
  fVar4 = local_68[5];
  fVar6 = local_68[7];
  fVar5 = local_68[6];
  fVar2 = local_68[3];
  fVar1 = local_68[2];
  if (threshold <=
      ABS((local_68[3] * local_68[7] - local_68[6] * local_68[4]) * local_68[2] +
          (local_68[4] * local_68[8] - local_68[7] * local_68[5]) * local_68[0] +
          (local_68[5] * local_68[6] - local_68[8] * local_68[3]) * local_68[1]) + -1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
  }
  pfVar9 = local_188;
  local_188[0] = 1.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  local_188[3] = 0.0;
  local_188[4] = 1.0;
  local_188[5] = 0.0;
  local_188[6] = 0.0;
  local_188[7] = 0.0;
  local_188[8] = 1.0;
  lVar8 = 0;
  do {
    lVar11 = 0;
    do {
      if (lVar8 == lVar11) {
        local_188[lVar8 * 4] = *(float *)(local_f4 + lVar8 * 4);
      }
      else {
        pfVar9[lVar11] = 0.0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar8 = lVar8 + 1;
    pfVar9 = pfVar9 + 3;
  } while (lVar8 != 3);
  local_c8 = ZEXT416((uint)fVar4);
  local_b8 = ZEXT416((uint)fVar2);
  local_158 = ZEXT416((uint)fVar13);
  local_148 = ZEXT416((uint)fVar1);
  local_a8 = ZEXT416((uint)fVar3);
  local_138 = ZEXT416((uint)fVar12);
  local_128 = ZEXT416((uint)fVar5);
  local_118 = ZEXT416((uint)fVar6);
  local_108 = ZEXT416((uint)fVar7);
  fVar17 = A->x[1][1];
  fVar18 = A->x[1][2];
  fVar19 = A->x[1][0];
  fVar14 = A->x[2][1];
  fVar15 = A->x[2][2];
  fVar16 = A->x[2][0];
  if (ABS(A->x[0][2] * (fVar19 * fVar14 - fVar16 * fVar17) +
          A->x[0][0] * (fVar17 * fVar15 - fVar14 * fVar18) +
          A->x[0][1] * (fVar18 * fVar16 - fVar15 * fVar19)) -
      ABS(local_188[2] * (local_188[3] * local_188[7] - local_188[6] * local_188[4]) +
          local_188[0] * (local_188[4] * local_188[8] - local_188[7] * local_188[5]) +
          local_188[1] * (local_188[5] * local_188[6] - local_188[8] * local_188[3])) < threshold) {
    local_d8 = fVar7 * local_188[6] + fVar5 * local_188[0] + fVar6 * local_188[3];
    uStack_d4 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    local_e8 = fVar7 * local_188[7] + fVar5 * local_188[1] + fVar6 * local_188[4];
    uStack_e4 = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    fVar18 = fVar7 * local_188[8] + fVar5 * local_188[2] + fVar6 * local_188[5];
    fVar19 = local_188[6] * fVar1 + local_188[0] * fVar12 + local_188[3] * fVar13;
    fVar20 = local_188[6] * fVar4 + local_188[0] * fVar2 + local_188[3] * fVar3;
    fVar14 = local_188[7] * fVar1 + local_188[1] * fVar12 + local_188[4] * fVar13;
    fVar15 = local_188[7] * fVar4 + local_188[1] * fVar2 + local_188[4] * fVar3;
    fVar16 = local_188[8] * fVar1 + local_188[2] * fVar12 + local_188[5] * fVar13;
    fVar17 = local_188[8] * fVar4 + local_188[2] * fVar2 + local_188[5] * fVar3;
    pfVar9 = &local_98;
    local_98 = fVar1 * fVar16 + fVar12 * fVar19 + fVar13 * fVar14;
    fStack_94 = fVar4 * fVar16 + fVar2 * fVar19 + fVar3 * fVar14;
    fStack_90 = fVar7 * fVar16 + fVar5 * fVar19 + fVar6 * fVar14;
    fStack_8c = fVar1 * fVar17 + fVar12 * fVar20 + fVar13 * fVar15;
    local_88 = fVar4 * fVar17 + fVar2 * fVar20 + fVar15 * fVar3;
    fStack_84 = fVar7 * fVar17 + fVar5 * fVar20 + fVar15 * fVar6;
    fStack_80 = fVar1 * fVar18 + fVar12 * local_d8 + local_e8 * fVar13;
    fStack_7c = fVar4 * fVar18 + fVar2 * local_d8 + local_e8 * fVar3;
    local_78 = fVar18 * fVar7 + local_d8 * fVar5 + local_e8 * fVar6;
    lVar8 = 0;
    do {
      lVar11 = 0;
      do {
        if (threshold <= ABS((*(float (*) [3])*(float (*) [3])A)[lVar11] - pfVar9[lVar11])) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar8 = lVar8 + 1;
      A = (Matrix33<float> *)((long)A + 0xc);
      pfVar9 = pfVar9 + 3;
    } while (lVar8 != 3);
    return;
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}